

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall libtorrent::aux::torrent::update_scrape_state(torrent *this)

{
  header_holder_type *phVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  announce_entry *t;
  node_ptr plVar6;
  uint uVar7;
  node_ptr plVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  
  phVar1 = &(this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header;
  plVar6 = (this->m_trackers).m_trackers.super_type.data_.root_plus_size_.m_header.super_node.next_;
  if (plVar6 == &phVar1->super_node) {
    uVar4 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    uVar7 = 0xffffffff;
    uVar10 = 0xffffffff;
    uVar11 = 0xffffffff;
  }
  else {
    uVar11 = 0xffffffff;
    uVar10 = 0xffffffff;
    uVar7 = 0xffffffff;
    do {
      for (plVar8 = plVar6[5].next_; plVar8 != plVar6[5].prev_;
          plVar8 = (node_ptr)&plVar8[0xc].prev_) {
        lVar9 = 0;
        do {
          uVar4 = (ulong)(byte)(&_ZGRN10libtorrent12_GLOBAL__N_112all_versionsE_)[lVar9];
          uVar5 = *(uint *)((long)plVar8 + uVar4 * 0x48 + 0x58);
          uVar3 = *(uint *)((long)plVar8 + uVar4 * 0x48 + 0x5c);
          if ((int)uVar11 < (int)uVar3) {
            uVar11 = uVar3;
          }
          if ((int)uVar10 < (int)uVar5) {
            uVar10 = uVar5;
          }
          uVar5 = *(uint *)((long)plVar8 + uVar4 * 0x48 + 0x60);
          if ((int)uVar7 < (int)uVar5) {
            uVar7 = uVar5;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 != 2);
      }
      plVar6 = plVar6->next_;
    } while (plVar6 != &phVar1->super_node);
    if ((((-1 < (int)uVar11) &&
         ((*(uint *)&(this->super_torrent_hot_members).field_0x48 & 0xffffff) != uVar11)) ||
        ((-1 < (int)uVar10 && ((*(uint *)&this->field_0x5dd & 0xffffff) != uVar10)))) ||
       ((-1 < (int)uVar7 && ((*(uint *)&this->field_0x600 >> 7 & 0xffffff) != uVar7)))) {
      state_updated(this);
    }
    uVar4 = *(ulong *)&(this->super_torrent_hot_members).field_0x48;
    if (((uint)uVar4 & 0xffffff) == uVar11) {
      uVar5 = *(uint *)&this->field_0x5dd;
      if (((uVar5 & 0xffffff) == uVar10) && ((*(uint *)&this->field_0x600 >> 7 & 0xffffff) == uVar7)
         ) {
        return;
      }
      goto LAB_003178f3;
    }
  }
  uVar5 = *(uint *)&this->field_0x5dd;
LAB_003178f3:
  *(ulong *)&(this->super_torrent_hot_members).field_0x48 =
       uVar4 & 0xffffffffff000000 | (ulong)(uVar11 & 0xffffff);
  *(uint *)&this->field_0x5dd = uVar5 & 0xff000000 | uVar10 & 0xffffff;
  *(uint *)&this->field_0x600 = *(uint *)&this->field_0x600 & 0x8000007f | (uVar7 & 0xffffff) << 7;
  update_auto_sequential(this);
  bVar2 = (this->m_need_save_resume_data).m_val;
  if ((bVar2 & 8) != 0) {
    return;
  }
  (this->m_need_save_resume_data).m_val = bVar2 | 8;
  state_updated(this);
  return;
}

Assistant:

void torrent::update_scrape_state()
	{
		// loop over all trackers and find the largest numbers for each scrape field
		// then update the torrent-wide understanding of number of downloaders and seeds
		int complete = -1;
		int incomplete = -1;
		int downloaded = -1;
		for (auto const& t : m_trackers)
		{
			for (auto const& aep : t.endpoints)
			{
				for (protocol_version const ih : all_versions)
				{
					auto const& a = aep.info_hashes[ih];
					complete = std::max(a.scrape_complete, complete);
					incomplete = std::max(a.scrape_incomplete, incomplete);
					downloaded = std::max(a.scrape_downloaded, downloaded);
				}
			}
		}

		if ((complete >= 0 && int(m_complete) != complete)
			|| (incomplete >= 0 && int(m_incomplete) != incomplete)
			|| (downloaded >= 0 && int(m_downloaded) != downloaded))
			state_updated();

		if (int(m_complete) != complete
			|| int(m_incomplete) != incomplete
			|| int(m_downloaded) != downloaded)
		{
			m_complete = std::uint32_t(complete);
			m_incomplete = std::uint32_t(incomplete);
			m_downloaded = std::uint32_t(downloaded);

			update_auto_sequential();

			// these numbers are cached in the resume data
			set_need_save_resume(torrent_handle::if_counters_changed);
		}
	}